

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallPtrSet.h
# Opt level: O1

pair<llvm::SmallPtrSetIterator<llbuild::buildsystem::Node_*>,_bool> * __thiscall
llvm::SmallPtrSetImpl<llbuild::buildsystem::Node_*>::insert
          (pair<llvm::SmallPtrSetIterator<llbuild::buildsystem::Node_*>,_bool>
           *__return_storage_ptr__,SmallPtrSetImpl<llbuild::buildsystem::Node_*> *this,Node *Ptr)

{
  pair<const_void_*const_*,_bool> pVar1;
  SmallPtrSetIteratorImpl local_28;
  
  pVar1 = SmallPtrSetImplBase::insert_imp(&this->super_SmallPtrSetImplBase,Ptr);
  local_28.Bucket = pVar1.first;
  local_28.End = (this->super_SmallPtrSetImplBase).CurArray;
  local_28.End = local_28.End +
                 (&(this->super_SmallPtrSetImplBase).CurArraySize)
                 [local_28.End == (this->super_SmallPtrSetImplBase).SmallArray];
  SmallPtrSetIteratorImpl::AdvanceIfNotValid(&local_28);
  (__return_storage_ptr__->first).super_SmallPtrSetIteratorImpl.Bucket = local_28.Bucket;
  (__return_storage_ptr__->first).super_SmallPtrSetIteratorImpl.End = local_28.End;
  __return_storage_ptr__->second = pVar1.second;
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> insert(PtrType Ptr) {
    auto p = insert_imp(PtrTraits::getAsVoidPointer(Ptr));
    return std::make_pair(makeIterator(p.first), p.second);
  }